

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ObjectivePropagation::ObjectivePropagation
          (ObjectivePropagation *this,HighsDomain *domain)

{
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *this_00;
  HighsCDouble *this_01;
  ulong uVar1;
  HighsInt *pHVar2;
  int iVar3;
  HighsMipSolver *pHVar4;
  HighsMipSolverData *pHVar5;
  pointer ppVar6;
  pointer pOVar7;
  pointer piVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__to;
  char *extraout_RDX_02;
  long lVar9;
  ulong uVar10;
  size_type __new_size;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  ObjectiveContributionTree contributionTree;
  value_type local_48;
  int *local_40;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *local_38;
  
  this->domain = domain;
  pHVar4 = domain->mipsolver;
  pHVar5 = (pHVar4->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this->objFunc = &pHVar5->objectiveFunction;
  this->cost = (pHVar4->model_->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->objectiveLowerContributions;
  (this->objectiveLowerContributions).
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectiveLowerContributions).
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectiveLowerContributions).
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contributionPartitionSets).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contributionPartitionSets).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contributionPartitionSets).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partitionCliqueData).
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitionCliqueData).
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitionCliqueData).
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = *(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl;
  uVar13 = (int)((ulong)((long)*(pointer *)
                                ((long)&(pHVar5->objectiveFunction).cliquePartitionStart + 8) -
                        lVar9) >> 2) - 1;
  if (uVar13 != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->propagationConsBuffer,&(pHVar5->objectiveFunction).objectiveVals);
    std::
    vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
    ::resize(&this->partitionCliqueData,
             ((long)(this->objFunc->cliquePartitionStart).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
             (long)(this->objFunc->cliquePartitionStart).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start) * 0x40000000 + -0x100000000 >> 0x20);
    lVar9 = *(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl;
  }
  this->isPropagated = false;
  this->capacityThreshold = INFINITY;
  __new_size = (size_type)(int)uVar13;
  (this->objectiveLower).hi = 0.0;
  (this->objectiveLower).lo = 0.0;
  this->numInfObjLower = 0;
  std::
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ::resize(this_00,(long)*(int *)(lVar9 + __new_size * 4));
  local_48.first = -1;
  local_48.second = -1;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (&this->contributionPartitionSets,__new_size,&local_48);
  this_01 = &this->objectiveLower;
  uVar11 = 0;
  __to = extraout_RDX;
  uVar14 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    uVar14 = uVar11;
  }
  while (uVar11 != uVar14) {
    ppVar6 = (this->contributionPartitionSets).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48 = (value_type)(ppVar6 + uVar11);
    local_40 = &ppVar6[uVar11].second;
    (this->partitionCliqueData).
    super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar11].rhs = 1;
    lVar12 = *(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    uVar10 = (ulong)*(int *)(lVar12 + uVar11 * 4);
    uVar1 = uVar11 + 1;
    lVar9 = uVar10 * 4;
    local_38 = this_00;
    for (; (long)uVar10 < (long)*(int *)(lVar12 + uVar1 * 4); uVar10 = uVar10 + 1) {
      iVar3 = *(int *)(*(long *)&(pHVar5->objectiveFunction).objectiveNonzeros.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar9);
      pOVar7 = (this->objectiveLowerContributions).
               super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (pOVar7->links).child[lVar9 * 2U + 0xfffffffffffffffe] = iVar3;
      (pOVar7->links).child[lVar9 * 2U + 0xffffffffffffffff] = (int)uVar11;
      dVar16 = this->cost[iVar3];
      if (dVar16 <= 0.0) {
        *(double *)((pOVar7->links).child + lVar9 * 2U + 0xfffffffffffffffc) = -dVar16;
        dVar16 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        bVar15 = dVar16 == 1.0;
      }
      else {
        HighsCDouble::operator+=(this_01,dVar16);
        *(double *)
         ((((this->objectiveLowerContributions).
            super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
            ._M_impl.super__Vector_impl_data._M_start)->links).child +
         lVar9 * 2U + 0xfffffffffffffffc) = this->cost[iVar3];
        pHVar2 = &(this->partitionCliqueData).
                  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].rhs;
        *pHVar2 = *pHVar2 + -1;
        dVar16 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        bVar15 = dVar16 == 0.0;
        __to = extraout_RDX_00;
      }
      if ((bVar15) && (!NAN(dVar16))) {
        ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
                  ((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)&local_48
                   ,(char *)(uVar10 & 0xffffffff),__to);
        __to = extraout_RDX_01;
      }
      lVar12 = *(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      lVar9 = lVar9 + 4;
    }
    uVar11 = uVar1;
    if ((long)*local_40 != -1) {
      HighsCDouble::operator-=
                (this_01,(this_00->
                         super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                         )._M_impl.super__Vector_impl_data._M_start[*local_40].contribution);
      __to = extraout_RDX_02;
    }
  }
  piVar8 = *(pointer *)((long)&(pHVar5->objectiveFunction).objectiveNonzeros + 8);
  lVar9 = *(long *)&(pHVar5->objectiveFunction).objectiveNonzeros.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl;
  lVar12 = (long)*(int *)(*(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl +
                         __new_size * 4);
  do {
    if ((int)((ulong)((long)piVar8 - lVar9) >> 2) <= lVar12) {
      recomputeCapacityThreshold(this);
      return;
    }
    iVar3 = *(int *)(*(long *)&(pHVar5->objectiveFunction).objectiveNonzeros.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar12 * 4);
    if (this->cost[iVar3] <= 0.0) {
      dVar16 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      if (dVar16 < INFINITY) goto LAB_002a04cf;
LAB_002a04fe:
      this->numInfObjLower = this->numInfObjLower + 1;
    }
    else {
      dVar16 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      if (dVar16 <= -INFINITY) goto LAB_002a04fe;
LAB_002a04cf:
      HighsCDouble::operator+=(this_01,this->cost[iVar3] * dVar16);
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

HighsDomain::ObjectivePropagation::ObjectivePropagation(HighsDomain* domain)
    : domain(domain),
      objFunc(&domain->mipsolver->mipdata_->objectiveFunction),
      cost(domain->mipsolver->model_->col_cost_.data()) {
  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  if (numPartitions != 0) {
    propagationConsBuffer = objFunc->getObjectiveValuesPacked();
    partitionCliqueData.resize(objFunc->getNumCliquePartitions());
  }

  isPropagated = false;
  capacityThreshold = kHighsInf;
  objectiveLower = 0.0;
  numInfObjLower = 0;
  objectiveLowerContributions.resize(partitionStarts[numPartitions]);
  contributionPartitionSets.resize(numPartitions,
                                   std::make_pair(HighsInt{-1}, HighsInt{-1}));

  // for each clique partition first set up all columns as contributing with
  // their largest possible value and then remove the largest contribution of
  // each clique partition. For these columns we do not need to check for finite
  // bounds as they must be binary. We do not assume, however, that they must be
  // unfixed but could be fixed to 0 or 1. We maintain a heap that fulfills the
  // invariant that the largest column may be not fixed to its value with the
  // larger contribution.
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    partitionCliqueData[i].rhs = 1;
    for (HighsInt j = partitionStarts[i]; j < partitionStarts[i + 1]; ++j) {
      HighsInt col = objNonzeros[j];
      objectiveLowerContributions[j].col = col;
      objectiveLowerContributions[j].partition = i;
      if (cost[col] > 0.0) {
        objectiveLower += cost[col];
        objectiveLowerContributions[j].contribution = cost[col];
        partitionCliqueData[i].rhs -= 1;
        if (domain->col_lower_[col] == 0.0) contributionTree.link(j);
      } else {
        objectiveLowerContributions[j].contribution = -cost[col];
        if (domain->col_upper_[col] == 1.0) contributionTree.link(j);
      }
    }

    HighsInt worstPos = contributionTree.first();
    if (worstPos != -1)
      objectiveLower -= objectiveLowerContributions[worstPos].contribution;
  }

  // add contribution of remaining objective nonzeros
  const HighsInt numObjNz = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNz; ++i) {
    HighsInt col = objNonzeros[i];
    if (cost[col] > 0.0) {
      if (domain->col_lower_[col] == -kHighsInf)
        ++numInfObjLower;
      else
        objectiveLower += domain->col_lower_[col] * cost[col];
    } else {
      if (domain->col_upper_[col] == kHighsInf)
        ++numInfObjLower;
      else
        objectiveLower += domain->col_upper_[col] * cost[col];
    }
  }

  recomputeCapacityThreshold();
  debugCheckObjectiveLower();
}